

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QGridLayoutItem_*> * __thiscall
QList<QGridLayoutItem_*>::fill(QList<QGridLayoutItem_*> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QGridLayoutItem_*> *pQVar3;
  char *in_RDX;
  __off_t __length;
  QArrayDataPointer<QGridLayoutItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGridLayoutItem *copy;
  DataPointer detached;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffff68;
  parameter_type in_stack_ffffffffffffff70;
  char *pcVar4;
  parameter_type in_stack_ffffffffffffff78;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<QGridLayoutItem_*> *in_stack_ffffffffffffff90;
  qsizetype local_30;
  QArrayDataPointer<QGridLayoutItem_*> local_28;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (char *)0xffffffffffffffff) {
    local_10 = (char *)size((QList<QGridLayoutItem_*> *)in_RDI);
  }
  QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGridLayoutItem_*>::needsDetach
                    ((QArrayDataPointer<QGridLayoutItem_*> *)in_stack_ffffffffffffff70);
  pcVar4 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<QGridLayoutItem_*> *)0x8ac402), qVar2 < (long)pcVar4)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QGridLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
    QArrayDataPointer<QGridLayoutItem_*>::detachCapacity
              (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    QArrayDataPointer<QGridLayoutItem_*>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QGridLayoutItem_*>::operator->(&local_28);
    QtPrivate::QPodArrayOps<QGridLayoutItem_*>::copyAppend
              ((QPodArrayOps<QGridLayoutItem_*> *)in_stack_ffffffffffffff80,
               (qsizetype)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    QArrayDataPointer<QGridLayoutItem_*>::swap
              ((QArrayDataPointer<QGridLayoutItem_*> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    QArrayDataPointer<QGridLayoutItem_*>::~QArrayDataPointer
              ((QArrayDataPointer<QGridLayoutItem_*> *)in_stack_ffffffffffffff70);
  }
  else {
    QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
    QArrayDataPointer<QGridLayoutItem_*>::begin((QArrayDataPointer<QGridLayoutItem_*> *)0x8ac4ca);
    QArrayDataPointer<QGridLayoutItem_*>::begin((QArrayDataPointer<QGridLayoutItem_*> *)0x8ac4d9);
    local_30 = size((QList<QGridLayoutItem_*> *)in_RDI);
    qMin<long_long>(&local_30,(longlong *)&local_10);
    QtPrivate::QPodArrayOps<QGridLayoutItem_*>::assign
              ((QPodArrayOps<QGridLayoutItem_*> *)in_stack_ffffffffffffff70,
               (QGridLayoutItem **)in_stack_ffffffffffffff68,(QGridLayoutItem **)0x8ac522,
               in_stack_ffffffffffffff78);
    pcVar4 = local_10;
    qVar2 = size((QList<QGridLayoutItem_*> *)in_RDI);
    if (qVar2 < (long)pcVar4) {
      pQVar3 = (QPodArrayOps<QGridLayoutItem_*> *)
               QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
      pcVar4 = local_10;
      size((QList<QGridLayoutItem_*> *)in_RDI);
      QtPrivate::QPodArrayOps<QGridLayoutItem_*>::copyAppend
                (pQVar3,(qsizetype)pcVar4,in_stack_ffffffffffffff70);
    }
    else {
      pcVar4 = local_10;
      qVar2 = size((QList<QGridLayoutItem_*> *)in_RDI);
      if ((long)pcVar4 < qVar2) {
        pQVar3 = (QPodArrayOps<QGridLayoutItem_*> *)
                 QArrayDataPointer<QGridLayoutItem_*>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<QGridLayoutItem_*>::truncate(pQVar3,local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QGridLayoutItem_*> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}